

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

int lyv_data_unique(lyd_node *list)

{
  ly_ctx *ctx_00;
  lys_node *plVar1;
  char *key_part;
  uint32_t hash_00;
  int iVar2;
  hash_table *phVar3;
  size_t len;
  ly_ctx *ctx;
  lys_node_list *slist;
  char *path;
  char *id;
  hash_table **uniqtables;
  uint local_40;
  uint32_t usize;
  uint32_t u;
  uint32_t hash;
  int ret;
  uint32_t n;
  uint32_t j;
  uint32_t i;
  ly_set *set;
  lyd_node *diter;
  lyd_node *list_local;
  
  hash = 0;
  u = 0;
  uniqtables._4_4_ = 0;
  id = (char *)0x0;
  ctx_00 = list->schema->module->ctx;
  if ((list->validity & 2) == 0) {
    list_local._4_4_ = 0;
  }
  else {
    plVar1 = list->schema;
    diter = list;
    iVar2 = ly_vlog_build_path(LY_VLOG_LYD,list,(char **)&slist,0,1);
    if (iVar2 == 0) {
      _j = lyd_find_path(diter,(char *)slist);
      free(slist);
      if (_j == (ly_set *)0x0) {
        list_local._4_4_ = 0xffffffff;
      }
      else {
        for (n = 0; n < _j->number; n = n + 1) {
          *(byte *)&(_j->set).s[n]->dsc = *(byte *)&(_j->set).s[n]->dsc & 0xfd;
        }
        if (_j->number == 2) {
          iVar2 = lyv_list_uniq_equal((_j->set).s,(_j->set).s + 1,0,(void *)0x0);
          if (iVar2 != 0) {
            ly_set_free(_j);
            return 1;
          }
        }
        else if (2 < _j->number) {
          for (local_40 = 0x1f;
              (local_40 != 0 &&
              (uniqtables._4_4_ = (_j->number << ((byte)local_40 & 0x1f)) >> ((byte)local_40 & 0x1f)
              , uniqtables._4_4_ != _j->number)); local_40 = local_40 - 1) {
          }
          if (local_40 == 0) {
            ly_log(ctx_00,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                   ,0x123);
            u = 0xffffffff;
          }
          else {
            local_40 = 0x20 - local_40;
            uniqtables._4_4_ = 1 << ((byte)local_40 & 0x1f);
            hash = (uint32_t)plVar1->padding[3];
            id = (char *)malloc((ulong)hash << 3);
            if (id == (char *)0x0) {
              ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyv_data_unique");
              u = 0xffffffff;
              hash = 0;
            }
            else {
              for (ret = 0; (uint)ret < hash; ret = ret + 1) {
                phVar3 = lyht_new(uniqtables._4_4_,8,lyv_list_uniq_equal,
                                  (void *)((ulong)(uint)ret + 1),0);
                *(hash_table **)(id + (ulong)(uint)ret * 8) = phVar3;
                if (*(long *)(id + (ulong)(uint)ret * 8) == 0) {
                  ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "lyv_data_unique");
                  u = 0xffffffff;
                  goto LAB_0012aa1d;
                }
              }
              for (local_40 = 0; local_40 < _j->number; local_40 = local_40 + 1) {
                for (ret = 0; (uint)ret < hash; ret = ret + 1) {
                  path = (char *)0x0;
                  usize = 0;
                  for (n = 0; n < *(byte *)(plVar1[1].ext + (ulong)(uint)ret * 2 + 1); n = n + 1) {
                    set = (ly_set *)
                          resolve_data_descendant_schema_nodeid
                                    ((char *)(&plVar1[1].ext[(ulong)(uint)ret * 2]->def)[n],
                                     (lyd_node *)(_j->set).s[local_40]->parent);
                    if ((lyd_node *)set == (lyd_node *)0x0) {
                      iVar2 = lyd_get_unique_default
                                        ((char *)(&plVar1[1].ext[(ulong)(uint)ret * 2]->def)[n],
                                         (lyd_node *)(_j->set).s[local_40],&path);
                      if (iVar2 != 0) {
                        u = 0xffffffff;
                        goto LAB_0012aa1d;
                      }
                    }
                    else {
                      path = (char *)((lyd_node *)set)->ht;
                    }
                    hash_00 = usize;
                    key_part = path;
                    if (path == (char *)0x0) break;
                    len = strlen(path);
                    usize = dict_hash_multi(hash_00,key_part,len);
                  }
                  if (path != (char *)0x0) {
                    usize = dict_hash_multi(usize,(char *)0x0,0);
                    iVar2 = lyht_insert(*(hash_table **)(id + (ulong)(uint)ret * 8),
                                        (_j->set).s + local_40,usize,(void **)0x0);
                    if (iVar2 != 0) {
                      u = 1;
                      goto LAB_0012aa1d;
                    }
                  }
                }
              }
            }
          }
        }
LAB_0012aa1d:
        ly_set_free(_j);
        ret = 0;
        while (((uint)ret < hash && (*(long *)(id + (ulong)(uint)ret * 8) != 0))) {
          lyht_free(*(hash_table **)(id + (ulong)(uint)ret * 8));
          ret = ret + 1;
        }
        free(id);
        list_local._4_4_ = u;
      }
    }
    else {
      list_local._4_4_ = 0xffffffff;
    }
  }
  return list_local._4_4_;
}

Assistant:

int
lyv_data_unique(struct lyd_node *list)
{
    struct lyd_node *diter;
    struct ly_set *set;
    uint32_t i, j, n = 0;
    int ret = 0;
    uint32_t hash, u, usize = 0;
    struct hash_table **uniqtables = NULL;
    const char *id;
    char *path;
    struct lys_node_list *slist;
    struct ly_ctx *ctx = list->schema->module->ctx;

    if (!(list->validity & LYD_VAL_UNIQUE)) {
        /* validated sa part of another instance validation */
        return 0;
    }

    slist = (struct lys_node_list *)list->schema;

    /* get all list instances */
    if (ly_vlog_build_path(LY_VLOG_LYD, list, &path, 0, 1)) {
        return -1;
    }
    set = lyd_find_path(list, path);
    free(path);
    if (!set) {
        return -1;
    }

    for (i = 0; i < set->number; ++i) {
        /* remove the flag */
        set->set.d[i]->validity &= ~LYD_VAL_UNIQUE;
    }

    if (set->number == 2) {
        /* simple comparison */
        if (lyv_list_uniq_equal(&set->set.d[0], &set->set.d[1], 0, (void *)0)) {
            /* instance duplication */
            ly_set_free(set);
            return 1;
        }
    } else if (set->number > 2) {
        /* use hashes for comparison */
        /* first, allocate the table, the size depends on number of items in the set */
        for (u = 31; u > 0; u--) {
            usize = set->number << u;
            usize = usize >> u;
            if (usize == set->number) {
                break;
            }
        }
        if (u == 0) {
            LOGINT(ctx);
            ret = -1;
            goto cleanup;
        } else {
            u = 32 - u;
            usize = 1 << u;
        }

        n = slist->unique_size;
        uniqtables = malloc(n * sizeof *uniqtables);
        if (!uniqtables) {
            LOGMEM(ctx);
            ret = -1;
            n = 0;
            goto cleanup;
        }
        for (j = 0; j < n; j++) {
            uniqtables[j] = lyht_new(usize, sizeof(struct lyd_node *), lyv_list_uniq_equal, (void *)(j + 1L), 0);
            if (!uniqtables[j]) {
                LOGMEM(ctx);
                ret = -1;
                goto cleanup;
            }
        }

        for (u = 0; u < set->number; u++) {
            /* loop for unique - get the hash for the instances */
            for (j = 0; j < n; j++) {
                id = NULL;
                for (i = hash = 0; i < slist->unique[j].expr_size; i++) {
                    diter = resolve_data_descendant_schema_nodeid(slist->unique[j].expr[i], set->set.d[u]->child);
                    if (diter) {
                        id = ((struct lyd_node_leaf_list *)diter)->value_str;
                    } else {
                        /* use default value */
                        if (lyd_get_unique_default(slist->unique[j].expr[i], set->set.d[u], &id)) {
                            ret = -1;
                            goto cleanup;
                        }
                    }
                    if (!id) {
                        /* unique item not present nor has default value */
                        break;
                    }
                    hash = dict_hash_multi(hash, id, strlen(id));
                }
                if (!id) {
                    /* skip this list instance since its unique set is incomplete */
                    continue;
                }

                /* finish the hash value */
                hash = dict_hash_multi(hash, NULL, 0);

                /* insert into the hashtable */
                if (lyht_insert(uniqtables[j], &set->set.d[u], hash, NULL)) {
                    ret = 1;
                    goto cleanup;
                }
            }
        }
    }

cleanup:
    ly_set_free(set);
    for (j = 0; j < n; j++) {
        if (!uniqtables[j]) {
            /* failed when allocating uniquetables[j], following j are not allocated */
            break;
        }
        lyht_free(uniqtables[j]);
    }
    free(uniqtables);

    return ret;
}